

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt_num.c
# Opt level: O3

char * lj_strfmt_wfnum(SBuf *sb,SFormat sf,lua_Number n,char *p)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  char cVar15;
  uint32_t *puVar16;
  byte *pbVar17;
  byte *pbVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  char *pcVar22;
  short sVar23;
  uint uVar24;
  SBuf *sb_00;
  uint32_t carry;
  uint uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint32_t uVar30;
  uint uVar31;
  lua_Number lVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  char nd9 [9];
  char ref9 [9];
  char local_198;
  int local_190;
  char local_181 [9];
  SBuf *local_178;
  ulong local_170;
  uint local_164;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  char local_141 [9];
  uint local_138 [31];
  uint local_bc;
  uint local_b8;
  uint local_b4 [33];
  
  uVar29 = sf >> 0x10 & 0xff;
  uVar11 = (uint)((ulong)n >> 0x20);
  uVar21 = SUB84(n,0);
  uVar31 = uVar29;
  if (uVar11 * 2 < 0xffe00000) {
    uVar2 = sf >> 0x18;
    local_160 = (ulong)uVar2;
    uVar19 = uVar2 - 1;
    local_170 = (ulong)uVar19;
    uVar3 = sf >> 4 & 3;
    if (uVar3 != 0) {
      local_178 = sb;
      if ((long)n < 0) {
        local_198 = '-';
      }
      else {
        if ((sf >> 9 & 1) != 0) {
          bVar34 = false;
          local_190 = 1;
          local_198 = '+';
          goto LAB_00114342;
        }
        if ((sf >> 0xb & 1) == 0) {
          bVar34 = true;
          local_198 = '\0';
          local_190 = 0;
          goto LAB_00114342;
        }
        local_198 = ' ';
      }
      local_190 = 1;
      bVar34 = false;
LAB_00114342:
      uVar9 = uVar11 >> 0x14 & 0x7ff;
      local_164 = uVar2 + 6;
      if (sf < 0x1000000) {
        uVar19 = uVar2 + 6;
      }
      uVar2 = (int)(uVar19 - 1) >> 0x1f ^ uVar19 - 1;
      if (uVar3 != 3) {
        uVar2 = uVar19;
      }
      if ((n == 0.0) && (!NAN(n))) goto LAB_001148cd;
      if ((sf & 0x10) == 0) goto LAB_001148cd;
      if (0xd < uVar2) goto LAB_001148cd;
      uVar7 = (ulong)(uVar9 >> 6);
      if (uVar7 - 0xf < 3) goto LAB_001148cd;
      iVar10 = (int)rescale_e[uVar7];
      dVar1 = n * rescale_n[uVar7];
      if (uVar9 == 0) {
        dVar1 = dVar1 * 10000000000.0;
        iVar10 = iVar10 + -10;
      }
      uVar19 = (uint)((long)dVar1 - 2U >> 0x20);
      local_138[0] = uVar19 & 0xfffff | 0x100000;
      uVar30 = (uVar19 >> 0x14 & 0x7ff) - 0x433;
      lVar32 = (lua_Number)((long)dVar1 - 2U);
LAB_00114937:
      local_138[0] = local_138[0] << 3 | SUB84(lVar32,0) >> 0x1d;
      uVar4 = nd_mul2k(local_138,0,0x1d,SUB84(lVar32,0) & 0x1fffffff,sf);
      uVar7 = (ulong)uVar4;
      if (-1 < (int)uVar30) goto LAB_00114995;
      uVar19 = -uVar30;
      bVar35 = false;
      if (uVar4 == 0) goto LAB_001149d8;
LAB_00114a06:
      iVar26 = (int)uVar7;
      uVar14 = uVar7;
      if (uVar19 < 0x13) {
        uVar25 = 0;
        uVar3 = 0xffffffff;
        uVar24 = 0xffffffff;
        if (8 < uVar19) goto LAB_00114afc;
      }
      else {
        if ((sf & 0x30) == 0x20) {
          uVar3 = (((int)local_160 * 0x1c71 - 0x1c71U >> 0x10) - (int)local_160) + 1;
          uVar3 = ((uVar3 & 0xffff) >> 0xf) + ((int)(short)uVar3 >> 3) + 0x3f & 0xffff;
          uVar24 = 0xffffffff;
        }
        else {
          iVar5 = 0x1f;
          if (local_138[uVar7] != 0) {
            for (; local_138[uVar7] >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          uVar3 = ((int)((double)(int)((iVar26 * 0x1d - uVar19) + iVar5) * 0.30102999566398114) -
                  (int)local_170) / 9 + 0x3e;
          sVar23 = (short)local_170;
          if (sVar23 < 0) {
            sVar23 = (short)local_164;
          }
          uVar24 = (0x3dU - ((int)sVar23 >> 3) & 0xffff) + iVar26;
        }
LAB_00114afc:
        uVar33 = 0;
        do {
          uVar25 = 0;
          uVar12 = uVar14;
          do {
            uVar28 = (uint)uVar12;
            uVar27 = local_138[uVar12];
            local_138[uVar12] = (uVar27 >> 9) + uVar25;
            uVar27 = uVar27 & 0x1ff;
            uVar25 = uVar27 * 0x1dcd65;
            uVar20 = (uint)uVar33;
            uVar12 = (ulong)(uVar28 - 1 & 0x3f);
          } while (uVar28 != uVar20);
          if ((uVar20 == uVar3) || (uVar20 == uVar24)) {
            if (local_138[uVar14] == 0) {
              if ((uint)uVar14 != uVar20) goto LAB_00114b7e;
              goto LAB_00114c09;
            }
          }
          else {
            if (uVar27 != 0) {
              uVar33 = (ulong)(uVar20 - 1 & 0x3f);
              local_138[uVar33] = uVar25;
            }
            if (local_138[uVar14] == 0) {
LAB_00114b7e:
              uVar14 = (ulong)((uint)uVar14 - 1 & 0x3f);
              uVar24 = uVar24 - 1;
            }
          }
          uVar25 = (uint)uVar33;
          uVar19 = uVar19 - 9;
        } while (8 < uVar19);
      }
      if (uVar19 == 0) {
LAB_00114c03:
        uVar14 = (ulong)uVar25;
      }
      else {
        bVar8 = (byte)uVar19;
        uVar19 = 0;
        do {
          uVar24 = (uint)uVar14;
          uVar3 = local_138[uVar14];
          local_138[uVar14] = (uVar3 >> (bVar8 & 0x1f)) + uVar19;
          uVar19 = (uVar3 & ~(-1 << (bVar8 & 0x1f))) * (1000000000U >> (bVar8 & 0x1f));
          uVar14 = (ulong)(uVar24 - 1 & 0x3f);
        } while (uVar24 != uVar25);
        if (uVar19 == 0) goto LAB_00114c03;
        uVar14 = (ulong)(uVar25 - 1 & 0x3f);
        local_138[uVar14] = uVar19;
      }
LAB_00114c09:
      uVar33 = 0;
      if (!bVar35) {
        uVar33 = (ulong)(iVar26 - (uint)(local_138[uVar7] == 0));
      }
LAB_00114c20:
      uVar3 = (uint)uVar14;
      uVar19 = uVar3;
      if ((sf & 0x10) == 0) {
        sb_00 = local_178;
        if (uVar2 < (-uVar3 & 0x3f) * 9) {
          uVar30 = nd_add_m10e(local_138,(uint32_t)uVar33,'\x05',~uVar2);
          uVar33 = (ulong)uVar30;
          sb_00 = local_178;
        }
        goto LAB_00115007;
      }
      uVar19 = local_138[uVar33];
      iVar26 = -1;
      if ((uVar3 != 0) && (uVar19 == 0)) {
        uVar33 = 0x40;
        do {
          uVar33 = (ulong)((int)uVar33 - 1);
          uVar19 = local_138[uVar33];
        } while (uVar19 == 0);
        iVar26 = -0x241;
      }
      iVar5 = 0x1f;
      if ((uVar19 | 1) != 0) {
        for (; (uVar19 | 1) >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      uVar25 = (uint)(iVar5 * 0x4d) >> 8;
      local_150 = (ulong)uVar25;
      local_158 = (ulong)(ndigits_dec_threshold[(ulong)uVar25 + 1] < uVar19);
      uVar25 = uVar25 + (ndigits_dec_threshold[(ulong)uVar25 + 1] < uVar19) + 1;
      uVar4 = (uint32_t)uVar33;
      if (iVar10 != 0) {
        lVar13 = (long)(int)(uVar30 + ((~(ulong)lVar32 & 0xffffffffffffe) == 0));
        local_b4[0] = uVar19;
        uVar7 = (ulong)(uVar4 - 1 & 0x3f);
        local_b8 = local_138[uVar7];
        uVar12 = (ulong)(uVar4 + 0x3e & 0x3f);
        local_bc = local_138[uVar12];
        nd_add_m10e(local_138,uVar4,four_ulp_m_e[lVar13 * 2 + 0x8c],
                    (int)four_ulp_m_e[lVar13 * 2 + 0x8d]);
        uVar19 = (uVar2 + 1) - uVar25;
        if (uVar2 + 1 < uVar25) {
          puVar16 = local_b4;
          uVar19 = (uVar2 - uVar25) + 10;
          uVar7 = uVar33;
LAB_00114d89:
          lj_strfmt_wuint9(local_181,local_138[uVar7]);
          lj_strfmt_wuint9(local_141,*puVar16);
          uVar7 = (ulong)uVar19;
          iVar5 = bcmp(local_181,local_141,uVar7);
          if ((iVar5 == 0) && (local_141[uVar7] < '5' == local_181[uVar7] < '5')) goto LAB_00114df0;
        }
        else if (local_138[uVar33] == local_b4[0]) {
          puVar16 = &local_b8;
          if (8 < uVar19) {
            if (local_138[uVar7] != local_b8) goto LAB_001148cd;
            puVar16 = &local_bc;
            uVar19 = uVar19 - 9;
            uVar7 = uVar12;
          }
          goto LAB_00114d89;
        }
LAB_001148cd:
        local_138[0] = uVar11 & 0xfffff;
        lVar32 = n;
        if (uVar9 == 0) {
          uVar30 = 0xfffffbee;
          if (uVar21 != 0) goto LAB_00114928;
        }
        else {
          local_138[0] = local_138[0] | 0x100000;
          uVar30 = uVar9 - 0x413;
          if (uVar21 != 0) {
LAB_00114928:
            uVar30 = uVar30 - 0x20;
            iVar10 = 0;
            goto LAB_00114937;
          }
          iVar10 = 0;
          uVar4 = 0;
          if (0x412 < uVar9) {
LAB_00114995:
            uVar14 = 0;
            uVar4 = nd_mul2k(local_138,uVar4,uVar30,0,sf);
            uVar33 = (ulong)uVar4;
            goto LAB_00114c20;
          }
        }
        uVar19 = -uVar30;
        iVar10 = 0;
LAB_001149d8:
        uVar33 = 0;
        if (local_138[0] == 0) goto LAB_00114a7f;
        uVar3 = 0;
        if (local_138[0] != 0) {
          for (; (local_138[0] >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        if (uVar3 <= uVar19 && uVar19 - uVar3 != 0) goto code_r0x001149f2;
        local_138[0] = local_138[0] >> ((byte)uVar19 & 0x1f);
LAB_00114a7f:
        uVar14 = 0;
        goto LAB_00114c20;
      }
LAB_00114df0:
      iVar26 = iVar26 + uVar4 * 9 + uVar25;
      if (SBORROW4(uVar2 - iVar26,(-uVar3 & 0x3f) * 9) !=
          (int)((uVar2 - iVar26) + (-uVar3 & 0x3f) * -9) < 0) {
        uVar30 = nd_add_m10e(local_138,uVar4,'\x05',~uVar2 + iVar26);
        uVar33 = (ulong)uVar30;
        uVar11 = local_138[uVar30] | 1;
        iVar5 = 0x1f;
        if (uVar11 != 0) {
          for (; uVar11 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        uVar11 = (uint)(iVar5 * 0x4d) >> 8;
        iVar26 = iVar26 + (uint)(uVar25 !=
                                uVar11 + 1 +
                                (uint)(ndigits_dec_threshold[(ulong)uVar11 + 1] < local_138[uVar30])
                                );
      }
      uVar11 = iVar26 + iVar10;
      if ((sf & 0x20) == 0) {
        uVar21 = sf & 0x1000;
      }
      else {
        uVar21 = uVar2 - uVar11;
        if (((int)uVar11 <= (int)uVar2) && (-5 < (int)uVar11)) {
          if ((int)uVar11 < 0) {
            uVar33 = 0;
          }
          bVar35 = (sf >> 0xc & 1) != 0;
          uVar19 = 0;
          if ((uVar29 == 0 || bVar35) || uVar21 == 0) {
            uVar19 = uVar3;
          }
          sb_00 = local_178;
          uVar2 = uVar21;
          if (((uVar29 != 0 && !bVar35) && uVar21 != 0) && (uVar2 = 0, uVar3 != 0)) {
            uVar2 = (0x40 - uVar3) * 9;
            if (uVar21 < uVar2) {
              uVar11 = 0x40 - (uVar21 + 8) / 9;
              lj_strfmt_wuint9(local_181,local_138[uVar11]);
              uVar14 = (ulong)uVar11;
              uVar2 = uVar21;
            }
            else {
              lj_strfmt_wuint9(local_181,local_138[uVar14]);
              if (uVar3 == 0x40) {
                uVar2 = 0;
                sb_00 = local_178;
                uVar19 = uVar3;
                goto LAB_00115007;
              }
            }
            sb_00 = local_178;
            uVar7 = (ulong)(uVar2 + (0x3f - (int)uVar14) * -9);
            do {
              uVar19 = (uint)uVar14;
              uVar11 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar11;
              if (local_181[uVar7] != '0') goto LAB_00115007;
              if (uVar11 == 0) {
                if (uVar19 == 0x3f) {
                  uVar2 = 0;
                  uVar19 = 0x3f;
                  goto LAB_00115007;
                }
                uVar14 = (ulong)(uVar19 + 1);
                lj_strfmt_wuint9(local_181,local_138[uVar14]);
                uVar7 = 9;
              }
              uVar2 = uVar2 - 1;
            } while (uVar2 != 0);
            uVar2 = 0;
            uVar19 = (uint)uVar14;
          }
LAB_00115007:
          iVar26 = (int)uVar33 * 9;
          uVar11 = local_138[uVar33];
          iVar10 = 0x1f;
          if ((uVar11 | 1) != 0) {
            for (; (uVar11 | 1) >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
          uVar3 = (uint)(iVar10 * 0x4d) >> 8;
          uVar21 = ndigits_dec_threshold[(ulong)uVar3 + 1];
          bVar35 = (sf & 0x1000) != 0 || uVar2 != 0;
          local_190 = local_190 + uVar2;
          uVar9 = uVar3 + local_190 + iVar26 + (uint)bVar35 + (uint)(uVar21 < uVar11) + 1;
          if (p == (char *)0x0) {
            uVar25 = uVar9;
            if (uVar9 < uVar29) {
              uVar25 = uVar29;
            }
            uVar24 = (sb_00->p).ptr32;
            p = (char *)(ulong)uVar24;
            if ((sb_00->e).ptr32 - uVar24 < uVar25 + 8) {
              p = lj_buf_more2(sb_00,uVar25 + 8);
            }
          }
          uVar11 = (uint)(uVar21 < uVar11);
          if ((sf & 0x500) == 0) {
            if (uVar9 < uVar29) {
              uVar31 = local_190 + (uint)bVar35 + uVar3 + iVar26 + uVar11;
              uVar7 = (ulong)((uVar29 - uVar31) - 2);
              memset(p,0x20,uVar7 + 1);
              p = p + uVar7 + 1;
            }
            else {
              uVar31 = uVar29 - 1;
            }
          }
          if (!bVar34) {
            *p = local_198;
            p = p + 1;
          }
          if ((sf & 0x500) == 0x400) {
            if (uVar9 < uVar31) {
              uVar11 = local_190 + (uint)bVar35 + uVar3 + iVar26 + uVar11;
              uVar7 = (ulong)((uVar31 - uVar11) - 2);
              memset(p,0x30,uVar7 + 1);
              p = p + uVar7 + 1;
              uVar31 = uVar11;
            }
            else {
              uVar31 = uVar31 - 1;
            }
          }
          pcVar6 = lj_strfmt_wint(p,local_138[uVar33]);
          for (; uVar33 != 0; uVar33 = uVar33 - 1) {
            pcVar6 = lj_strfmt_wuint9(pcVar6,local_138[uVar33 - 1]);
          }
          if ((sf & 0x1000) == 0 && uVar2 == 0) goto LAB_00115597;
          *pcVar6 = '.';
          pcVar6 = pcVar6 + 1;
          if ((0 < (int)uVar2) && (uVar19 != 0)) {
            uVar7 = 0;
            uVar11 = uVar2;
            do {
              uVar29 = (int)uVar7 - 1U & 0x3f;
              uVar7 = (ulong)uVar29;
              pcVar6 = lj_strfmt_wuint9(pcVar6,local_138[uVar7]);
              uVar2 = uVar11 - 9;
              if (uVar11 < 10) break;
              uVar11 = uVar2;
            } while (uVar29 != uVar19);
          }
          if ((sf & 0x1010) == 0x10) {
            pcVar6 = pcVar6 + (int)((int)uVar2 >> 0x1f & uVar2);
            do {
              pcVar22 = pcVar6;
              pcVar6 = pcVar22 + -1;
            } while (pcVar22[-1] == '0');
            if (pcVar22[-1] != '.') {
              pcVar6 = pcVar22;
            }
          }
          else {
            if (0 < (int)uVar2) {
              memset(pcVar6,0x30,(ulong)uVar2);
              pcVar6 = pcVar6 + uVar2;
              uVar2 = 0;
            }
            pcVar6 = pcVar6 + (int)uVar2;
          }
          goto LAB_00115597;
        }
        uVar21 = sf & 0x1000;
        if (((uVar29 < 6) || (uVar21 != 0)) || (uVar2 == 0)) goto LAB_00114e95;
        uVar21 = (uint)uVar33;
        uVar19 = uVar21 - uVar3 & 0x3f;
        uVar31 = uVar19 * 9 + (int)local_150 + (int)local_158;
        if (uVar2 < uVar31) {
          iVar10 = uVar2 - uVar25;
          uVar31 = (((uint)((short)((short)iVar10 + 9) * 0x1c71) >> 0x10) - iVar10) - 9;
          uVar31 = ((int)(short)uVar31 >> 3) + ((uVar31 & 0xffff) >> 0xf) & 0xffff;
          uVar14 = (ulong)(uVar21 + uVar31 & 0x3f);
          uVar19 = -uVar31 & 0x3f;
          lj_strfmt_wuint9(local_181,local_138[uVar14]);
          uVar31 = uVar2;
LAB_00115627:
          uVar7 = (ulong)(iVar10 + uVar19 * -9 + 10);
          do {
            uVar3 = (uint)uVar14;
            uVar19 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar19;
            uVar2 = uVar31;
            if (local_181[uVar7] != '0') goto LAB_0011574d;
            if (uVar19 == 0) {
              if (uVar3 == uVar21) {
                uVar3 = uVar21;
                uVar2 = 0;
                goto LAB_0011574d;
              }
              uVar14 = (ulong)(uVar3 + 1 & 0x3f);
              lj_strfmt_wuint9(local_181,local_138[uVar14]);
              uVar7 = 9;
            }
            uVar31 = uVar31 - 1;
          } while (uVar31 != 0);
          uVar3 = (uint)uVar14;
          uVar2 = 0;
        }
        else {
          lj_strfmt_wuint9(local_181,local_138[uVar14]);
          if (uVar31 != 0) {
            iVar10 = uVar31 - uVar25;
            goto LAB_00115627;
          }
          uVar2 = 0;
        }
LAB_0011574d:
        uVar21 = 0;
      }
LAB_00114e95:
      uVar19 = -uVar11;
      if (0 < (int)uVar11) {
        uVar19 = uVar11;
      }
      iVar10 = 0x1f;
      if ((uVar19 | 1) != 0) {
        for (; (uVar19 | 1) >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      uVar27 = (uint)(iVar10 * 0x4d) >> 8;
      uVar25 = (uint)(uVar19 < 10);
      bVar35 = uVar21 != 0 || uVar2 != 0;
      uVar24 = (uint)(ndigits_dec_threshold[uVar27 + 1] < uVar19);
      uVar9 = (uint)bVar35 + local_190 + uVar25 + uVar27 + uVar2 + uVar24 + 4;
      if (p == (char *)0x0) {
        uVar31 = uVar9;
        if (uVar9 < uVar29) {
          uVar31 = uVar29;
        }
        uVar20 = (local_178->p).ptr32;
        p = (char *)(ulong)uVar20;
        if ((local_178->e).ptr32 - uVar20 < uVar31 + 5) {
          p = lj_buf_more2(local_178,uVar31 + 5);
        }
      }
      uVar20 = (uint)bVar35;
      if ((sf & 0x500) == 0) {
        if (uVar9 < uVar29) {
          iVar10 = local_190 + uVar2 + uVar25 + uVar27 + uVar24;
          uVar7 = (ulong)(((uVar29 - iVar10) - uVar20) - 5);
          memset(p,0x20,uVar7 + 1);
          p = p + uVar7 + 1;
          uVar29 = uVar20 + 3 + iVar10;
        }
        else {
          uVar29 = uVar29 - 1;
        }
      }
      if (!bVar34) {
        *p = local_198;
        p = p + 1;
      }
      uVar31 = uVar29;
      if ((sf & 0x500) == 0x400) {
        if (uVar9 < uVar29) {
          iVar10 = local_190 + uVar2 + uVar25 + uVar27 + uVar24;
          uVar7 = (ulong)(((uVar29 - iVar10) - uVar20) - 5);
          memset(p,0x30,uVar7 + 1);
          p = p + uVar7 + 1;
          uVar31 = uVar20 + iVar10 + 3;
        }
        else {
          uVar31 = uVar29 - 1;
        }
      }
      pcVar6 = lj_strfmt_wint(p + 1,local_138[uVar33]);
      *p = p[1];
      pbVar18 = (byte *)(p + 1);
      if (uVar21 != 0 || uVar2 != 0) {
        p[1] = '.';
        uVar29 = uVar2 + ((int)p - (int)pcVar6) + 2;
        uVar21 = uVar29;
        if (0 < (int)uVar29) {
          do {
            uVar21 = uVar29;
            if ((uint)uVar33 == uVar3) break;
            uVar33 = (ulong)((uint)uVar33 - 1 & 0x3f);
            pcVar6 = lj_strfmt_wuint9(pcVar6,local_138[uVar33]);
            uVar21 = uVar29 - 9;
            bVar34 = 9 < uVar29;
            uVar29 = uVar21;
          } while (bVar34);
        }
        if ((sf & 0x1020) == 0x20) {
          pbVar18 = (byte *)(pcVar6 + (int)((int)uVar21 >> 0x1f & uVar21));
          do {
            pbVar17 = pbVar18;
            pbVar18 = pbVar17 + -1;
          } while (pbVar17[-1] == 0x30);
          if (pbVar17[-1] != 0x2e) {
            pbVar18 = pbVar17;
          }
        }
        else {
          if (0 < (int)uVar21) {
            memset(pcVar6,0x30,(ulong)uVar21);
            pcVar6 = pcVar6 + uVar21;
            uVar21 = 0;
          }
          pbVar18 = (byte *)(pcVar6 + (int)uVar21);
        }
      }
      *pbVar18 = ((sf >> 0xd & 1) == 0) << 5 | 0x45;
      pbVar18[1] = (char)((int)uVar11 >> 0x1f) * -2 + 0x2b;
      if (uVar19 < 10) {
        pbVar18[2] = 0x30;
        pbVar18 = pbVar18 + 3;
      }
      else {
        pbVar18 = pbVar18 + 2;
      }
      goto LAB_0011558a;
    }
    pcVar6 = "0123456789ABCDEFPX";
    if ((sf >> 0xd & 1) == 0) {
      pcVar6 = "0123456789abcdefpx";
    }
    uVar11 = uVar11 >> 0x14 & 0x7ff;
    iVar10 = 6;
    if ((long)n < 0) {
      cVar15 = '-';
LAB_00114428:
      bVar34 = false;
    }
    else {
      if ((sf >> 9 & 1) != 0) {
        cVar15 = '+';
        goto LAB_00114428;
      }
      if ((sf >> 0xb & 1) != 0) {
        cVar15 = ' ';
        goto LAB_00114428;
      }
      bVar34 = true;
      iVar10 = 5;
      cVar15 = '\0';
    }
    uVar7 = (ulong)n & 0xfffffffffffff;
    if (uVar11 == 0) {
      uVar11 = (uint)(uVar7 >> 0x20);
      if (uVar11 == 0 && uVar21 == 0) {
        uVar14 = 0;
      }
      else {
        iVar26 = 0x1f;
        if (uVar21 != 0) {
          for (; uVar21 >> iVar26 == 0; iVar26 = iVar26 + -1) {
          }
        }
        iVar5 = 0x1f;
        if (uVar11 != 0) {
          for (; uVar11 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        bVar35 = uVar7 >> 0x20 == 0;
        if (bVar35) {
          iVar5 = iVar26;
        }
        iVar5 = ((uint)bVar35 << 5 | 0x14) - iVar5;
        uVar14 = (ulong)(-iVar5 - 0x3fe);
        uVar7 = uVar7 << ((byte)iVar5 & 0x3f);
      }
    }
    else {
      uVar7 = uVar7 + 0x10000000000000;
      uVar14 = (ulong)(uVar11 - 0x3ff);
    }
    uVar11 = (uint)uVar14;
    if (sf < 0x1000000) {
      uVar31 = (uint)uVar7;
      if (uVar31 == 0) {
        uVar31 = (uint)(uVar7 >> 0x20) | 0x100000;
        uVar21 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        iVar26 = 5;
      }
      else {
        uVar21 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        iVar26 = 0xd;
      }
      local_170 = (ulong)(iVar26 - (uVar21 >> 2));
    }
    else if (uVar19 < 0xd) {
      uVar7 = uVar7 + (1L << ((char)uVar19 * -4 + 0x33U & 0x3f));
    }
    uVar19 = -uVar11;
    if (0 < (int)uVar11) {
      uVar19 = uVar11;
    }
    iVar26 = 0x1f;
    if ((uVar19 | 1) != 0) {
      for (; (uVar19 | 1) >> iVar26 == 0; iVar26 = iVar26 + -1) {
      }
    }
    uVar2 = (uint)(iVar26 * 0x4d) >> 8;
    iVar26 = (int)local_170;
    uVar11 = (uint)((sf & 0x1000) != 0 || iVar26 != 0);
    uVar21 = (uint)(ndigits_dec_threshold[uVar2 + 1] < uVar19);
    uVar9 = iVar10 + uVar2 + 1 + iVar26 + uVar11 + uVar21;
    if (p == (char *)0x0) {
      uVar31 = uVar9;
      if (uVar9 < uVar29) {
        uVar31 = uVar29;
      }
      uVar3 = (sb->p).ptr32;
      p = (char *)(ulong)uVar3;
      if ((sb->e).ptr32 - uVar3 < uVar31) {
        p = lj_buf_more2(sb,uVar31);
      }
    }
    iVar5 = (int)local_170;
    uVar3 = uVar29;
    if ((sf & 0x500) == 0) {
      if (uVar9 < uVar29) {
        uVar3 = iVar5 + iVar10 + uVar2 + uVar11 + uVar21;
        uVar33 = (ulong)((uVar29 - uVar3) - 2);
        memset(p,0x20,uVar33 + 1);
        iVar5 = (int)local_170;
        p = p + uVar33 + 1;
      }
      else {
        uVar3 = uVar29 - 1;
      }
    }
    if (!bVar34) {
      *p = cVar15;
      p = p + 1;
    }
    *p = '0';
    pcVar22 = p + 2;
    p[1] = ((sf >> 0xd & 1) == 0) << 5 | 0x58;
    uVar31 = uVar3;
    if ((sf & 0x500) == 0x400) {
      if (uVar9 < uVar3) {
        uVar31 = iVar10 + iVar5 + uVar2 + uVar11 + uVar21;
        uVar33 = (ulong)((uVar3 - uVar31) - 2);
        memset(pcVar22,0x30,uVar33 + 1);
        pcVar22 = p + uVar33 + 3;
      }
      else {
        uVar31 = uVar3 - 1;
      }
    }
    pbVar18 = (byte *)(pcVar22 + 1);
    *pcVar22 = (char)(uVar7 >> 0x34) + '0';
    if ((sf & 0x1000) != 0 || iVar26 != 0) {
      uVar11 = (uint)local_170;
      pbVar18 = (byte *)(pcVar22 + (local_170 & 0xffffffff) + 2);
      pcVar22[1] = '.';
      if (uVar11 < 0xd) {
        uVar7 = uVar7 >> ((char)local_170 * -4 + 0x34U & 0x3f);
        uVar33 = local_170;
        if (uVar11 == 0) goto LAB_00114746;
      }
      else {
        if (uVar11 != 0xd) {
          memset(pcVar22 + ((local_170 & 0xffffffff) - (ulong)(uVar11 - 0xe)) + 1,0x30,
                 (ulong)(uVar11 - 0xd));
        }
        uVar33 = 0xd;
      }
      uVar33 = uVar33 & 0xffffffff;
      do {
        uVar12 = uVar33 - 1;
        pcVar22[uVar33 + 1] = pcVar6[(uint)uVar7 & 0xf];
        uVar7 = uVar7 >> 4;
        uVar33 = uVar12;
      } while ((int)uVar12 != 0);
    }
LAB_00114746:
    *pbVar18 = ((sf >> 0xd & 1) == 0) << 5 | 0x50;
    pbVar18[1] = (char)(uVar14 >> 0x1f) * '\x02' + 0x2b;
    pbVar18 = pbVar18 + 2;
LAB_0011558a:
    pcVar6 = lj_strfmt_wint((char *)pbVar18,uVar19);
    goto LAB_00115597;
  }
  uVar11 = (int)(sf << 0x12) >> 0x1f & 0x202020;
  if (uVar21 == 0 && ((ulong)n & 0xfffff00000000) == 0) {
    uVar11 = uVar11 ^ 0x696e66;
    if ((long)n < 0) {
      cVar15 = '-';
    }
    else {
      cVar15 = '+';
      if (((sf >> 9 & 1) == 0) && (cVar15 = (char)((sf & 0x800) >> 6), (sf & 0x800) == 0)) {
        bVar34 = false;
        uVar9 = 3;
        goto LAB_0011483f;
      }
    }
LAB_00114836:
    uVar9 = 4;
    bVar34 = true;
  }
  else {
    uVar11 = uVar11 ^ 0x6e616e;
    cVar15 = (char)((sf & 0x800) >> 6);
    if ((sf & 0x800) != 0) goto LAB_00114836;
    bVar34 = false;
    uVar9 = 3;
  }
LAB_0011483f:
  if (p == (char *)0x0) {
    uVar21 = uVar9;
    if (uVar9 < uVar29) {
      uVar21 = uVar29;
    }
    uVar19 = (sb->p).ptr32;
    p = (char *)(ulong)uVar19;
    if ((sb->e).ptr32 - uVar19 < uVar21) {
      p = lj_buf_more2(sb,uVar21);
    }
  }
  if (((sf >> 8 & 1) == 0) && (uVar31 = uVar29 - 1, uVar9 < uVar29)) {
    memset(p,0x20,(ulong)(uVar31 - uVar9) + 1);
    p = p + (ulong)(uVar31 - uVar9) + 1;
    uVar31 = uVar9 - 1;
  }
  if (bVar34) {
    *p = cVar15;
    p = p + 1;
  }
  *p = (char)(uVar11 >> 0x10);
  p[1] = (char)(uVar11 >> 8);
  p[2] = (char)uVar11;
  pcVar6 = p + 3;
LAB_00115597:
  if (((sf >> 8 & 1) != 0) && (uVar9 < uVar31)) {
    memset(pcVar6,0x20,(ulong)(uVar31 + ~uVar9) + 1);
    pcVar6 = pcVar6 + (ulong)(uVar31 + ~uVar9) + 1;
  }
  return pcVar6;
code_r0x001149f2:
  local_138[0] = local_138[0] >> ((byte)uVar3 & 0x1f);
  uVar7 = 0;
  bVar35 = true;
  uVar19 = uVar19 - uVar3;
  goto LAB_00114a06;
}

Assistant:

static char *lj_strfmt_wfnum(SBuf *sb, SFormat sf, lua_Number n, char *p)
{
  MSize width = STRFMT_WIDTH(sf), prec = STRFMT_PREC(sf), len;
  TValue t;
  t.n = n;
  if (LJ_UNLIKELY((t.u32.hi << 1) >= 0xffe00000)) {
    /* Handle non-finite values uniformly for %a, %e, %f, %g. */
    int prefix = 0, ch = (sf & STRFMT_F_UPPER) ? 0x202020 : 0;
    if (((t.u32.hi & 0x000fffff) | t.u32.lo) != 0) {
      ch ^= ('n' << 16) | ('a' << 8) | 'n';
      if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    } else {
      ch ^= ('i' << 16) | ('n' << 8) | 'f';
      if ((t.u32.hi & 0x80000000)) prefix = '-';
      else if ((sf & STRFMT_F_PLUS)) prefix = '+';
      else if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    }
    len = 3 + (prefix != 0);
    if (!p) p = lj_buf_more(sb, width > len ? width : len);
    if (!(sf & STRFMT_F_LEFT)) while (width-- > len) *p++ = ' ';
    if (prefix) *p++ = prefix;
    *p++ = (char)(ch >> 16); *p++ = (char)(ch >> 8); *p++ = (char)ch;
  } else if (STRFMT_FP(sf) == STRFMT_FP(STRFMT_T_FP_A)) {
    /* %a */
    const char *hexdig = (sf & STRFMT_F_UPPER) ? "0123456789ABCDEFPX"
					       : "0123456789abcdefpx";
    int32_t e = (t.u32.hi >> 20) & 0x7ff;
    char prefix = 0, eprefix = '+';
    if (t.u32.hi & 0x80000000) prefix = '-';
    else if ((sf & STRFMT_F_PLUS)) prefix = '+';
    else if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    t.u32.hi &= 0xfffff;
    if (e) {
      t.u32.hi |= 0x100000;
      e -= 1023;
    } else if (t.u32.lo | t.u32.hi) {
      /* Non-zero denormal - normalise it. */
      uint32_t shift = t.u32.hi ? 20-lj_fls(t.u32.hi) : 52-lj_fls(t.u32.lo);
      e = -1022 - shift;
      t.u64 <<= shift;
    }
    /* abs(n) == t.u64 * 2^(e - 52) */
    /* If n != 0, bit 52 of t.u64 is set, and is the highest set bit. */
    if ((int32_t)prec < 0) {
      /* Default precision: use smallest precision giving exact result. */
      prec = t.u32.lo ? 13-lj_ffs(t.u32.lo)/4 : 5-lj_ffs(t.u32.hi|0x100000)/4;
    } else if (prec < 13) {
      /* Precision is sufficiently low as to maybe require rounding. */
      t.u64 += (((uint64_t)1) << (51 - prec*4));
    }
    if (e < 0) {
      eprefix = '-';
      e = -e;
    }
    len = 5 + ndigits_dec((uint32_t)e) + prec + (prefix != 0)
	    + ((prec | (sf & STRFMT_F_ALT)) != 0);
    if (!p) p = lj_buf_more(sb, width > len ? width : len);
    if (!(sf & (STRFMT_F_LEFT | STRFMT_F_ZERO))) {
      while (width-- > len) *p++ = ' ';
    }
    if (prefix) *p++ = prefix;
    *p++ = '0';
    *p++ = hexdig[17]; /* x or X */
    if ((sf & (STRFMT_F_LEFT | STRFMT_F_ZERO)) == STRFMT_F_ZERO) {
      while (width-- > len) *p++ = '0';
    }
    *p++ = '0' + (t.u32.hi >> 20); /* Usually '1', sometimes '0' or '2'. */
    if ((prec | (sf & STRFMT_F_ALT))) {
      /* Emit fractional part. */
      char *q = p + 1 + prec;
      *p = '.';
      if (prec < 13) t.u64 >>= (52 - prec*4);
      else while (prec > 13) p[prec--] = '0';
      while (prec) { p[prec--] = hexdig[t.u64 & 15]; t.u64 >>= 4; }
      p = q;
    }
    *p++ = hexdig[16]; /* p or P */
    *p++ = eprefix; /* + or - */
    p = lj_strfmt_wint(p, e);
  } else {
    /* %e or %f or %g - begin by converting n to "nd" format. */
    uint32_t nd[64];
    uint32_t ndhi = 0, ndlo, i;
    int32_t e = (t.u32.hi >> 20) & 0x7ff, ndebias = 0;
    char prefix = 0, *q;
    if (t.u32.hi & 0x80000000) prefix = '-';
    else if ((sf & STRFMT_F_PLUS)) prefix = '+';
    else if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    prec += ((int32_t)prec >> 31) & 7; /* Default precision is 6. */
    if (STRFMT_FP(sf) == STRFMT_FP(STRFMT_T_FP_G)) {
      /* %g - decrement precision if non-zero (to make it like %e). */
      prec--;
      prec ^= (uint32_t)((int32_t)prec >> 31);
    }
    if ((sf & STRFMT_T_FP_E) && prec < 14 && n != 0) {
      /* Precision is sufficiently low that rescaling will probably work. */
      if ((ndebias = rescale_e[e >> 6])) {
	t.n = n * rescale_n[e >> 6];
	if (LJ_UNLIKELY(!e)) t.n *= 1e10, ndebias -= 10;
	t.u64 -= 2; /* Convert 2ulp below (later we convert 2ulp above). */
	nd[0] = 0x100000 | (t.u32.hi & 0xfffff);
	e = ((t.u32.hi >> 20) & 0x7ff) - 1075 - (ND_MUL2K_MAX_SHIFT < 29);
	goto load_t_lo; rescale_failed:
	t.n = n;
	e = (t.u32.hi >> 20) & 0x7ff;
	ndebias = ndhi = 0;
      }
    }
    nd[0] = t.u32.hi & 0xfffff;
    if (e == 0) e++; else nd[0] |= 0x100000;
    e -= 1043;
    if (t.u32.lo) {
      e -= 32 + (ND_MUL2K_MAX_SHIFT < 29); load_t_lo:
#if ND_MUL2K_MAX_SHIFT >= 29
      nd[0] = (nd[0] << 3) | (t.u32.lo >> 29);
      ndhi = nd_mul2k(nd, ndhi, 29, t.u32.lo & 0x1fffffff, sf);
#elif ND_MUL2K_MAX_SHIFT >= 11
      ndhi = nd_mul2k(nd, ndhi, 11, t.u32.lo >> 21, sf);
      ndhi = nd_mul2k(nd, ndhi, 11, (t.u32.lo >> 10) & 0x7ff, sf);
      ndhi = nd_mul2k(nd, ndhi, 11, (t.u32.lo <<  1) & 0x7ff, sf);
#else
#error "ND_MUL2K_MAX_SHIFT too small"
#endif
    }
    if (e >= 0) {
      ndhi = nd_mul2k(nd, ndhi, (uint32_t)e, 0, sf);
      ndlo = 0;
    } else {
      ndlo = nd_div2k(nd, ndhi, (uint32_t)-e, sf);
      if (ndhi && !nd[ndhi]) ndhi--;
    }
    /* abs(n) == nd * 10^ndebias (for slightly loose interpretation of ==) */
    if ((sf & STRFMT_T_FP_E)) {
      /* %e or %g - assume %e and start by calculating nd's exponent (nde). */
      char eprefix = '+';
      int32_t nde = -1;
      MSize hilen;
      if (ndlo && !nd[ndhi]) {
	ndhi = 64; do {} while (!nd[--ndhi]);
	nde -= 64 * 9;
      }
      hilen = ndigits_dec(nd[ndhi]);
      nde += ndhi * 9 + hilen;
      if (ndebias) {
	/*
	** Rescaling was performed, but this introduced some error, and might
	** have pushed us across a rounding boundary. We check whether this
	** error affected the result by introducing even more error (2ulp in
	** either direction), and seeing whether a rounding boundary was
	** crossed. Having already converted the -2ulp case, we save off its
	** most significant digits, convert the +2ulp case, and compare them.
	*/
	int32_t eidx = e + 70 + (ND_MUL2K_MAX_SHIFT < 29)
			 + (t.u32.lo >= 0xfffffffe && !(~t.u32.hi << 12));
	const int8_t *m_e = four_ulp_m_e + eidx * 2;
	lj_assertG_(G(sbufL(sb)), 0 <= eidx && eidx < 128, "bad eidx %d", eidx);
	nd[33] = nd[ndhi];
	nd[32] = nd[(ndhi - 1) & 0x3f];
	nd[31] = nd[(ndhi - 2) & 0x3f];
	nd_add_m10e(nd, ndhi, (uint8_t)*m_e, m_e[1]);
	if (LJ_UNLIKELY(!nd_similar(nd, ndhi, nd + 33, hilen, prec + 1))) {
	  goto rescale_failed;
	}
      }
      if ((int32_t)(prec - nde) < (0x3f & -(int32_t)ndlo) * 9) {
	/* Precision is sufficiently low as to maybe require rounding. */
	ndhi = nd_add_m10e(nd, ndhi, 5, nde - prec - 1);
	nde += (hilen != ndigits_dec(nd[ndhi]));
      }
      nde += ndebias;
      if ((sf & STRFMT_T_FP_F)) {
	/* %g */
	if ((int32_t)prec >= nde && nde >= -4) {
	  if (nde < 0) ndhi = 0;
	  prec -= nde;
	  goto g_format_like_f;
	} else if (!(sf & STRFMT_F_ALT) && prec && width > 5) {
	  /* Decrease precision in order to strip trailing zeroes. */
	  char tail[9];
	  uint32_t maxprec = hilen - 1 + ((ndhi - ndlo) & 0x3f) * 9;
	  if (prec >= maxprec) prec = maxprec;
	  else ndlo = (ndhi - (((int32_t)(prec - hilen) + 9) / 9)) & 0x3f;
	  i = prec - hilen - (((ndhi - ndlo) & 0x3f) * 9) + 10;
	  lj_strfmt_wuint9(tail, nd[ndlo]);
	  while (prec && tail[--i] == '0') {
	    prec--;
	    if (!i) {
	      if (ndlo == ndhi) { prec = 0; break; }
	      ndlo = (ndlo + 1) & 0x3f;
	      lj_strfmt_wuint9(tail, nd[ndlo]);
	      i = 9;
	    }
	  }
	}
      }
      if (nde < 0) {
	/* Make nde non-negative. */
	eprefix = '-';
	nde = -nde;
      }
      len = 3 + prec + (prefix != 0) + ndigits_dec((uint32_t)nde) + (nde < 10)
	      + ((prec | (sf & STRFMT_F_ALT)) != 0);
      if (!p) p = lj_buf_more(sb, (width > len ? width : len) + 5);
      if (!(sf & (STRFMT_F_LEFT | STRFMT_F_ZERO))) {
	while (width-- > len) *p++ = ' ';
      }
      if (prefix) *p++ = prefix;
      if ((sf & (STRFMT_F_LEFT | STRFMT_F_ZERO)) == STRFMT_F_ZERO) {
	while (width-- > len) *p++ = '0';
      }
      q = lj_strfmt_wint(p + 1, nd[ndhi]);
      p[0] = p[1]; /* Put leading digit in the correct place. */
      if ((prec | (sf & STRFMT_F_ALT))) {
	/* Emit fractional part. */
	p[1] = '.'; p += 2;
	prec -= (MSize)(q - p); p = q; /* Account for digits already emitted. */
	/* Then emit chunks of 9 digits (this may emit 8 digits too many). */
	for (i = ndhi; (int32_t)prec > 0 && i != ndlo; prec -= 9) {
	  i = (i - 1) & 0x3f;
	  p = lj_strfmt_wuint9(p, nd[i]);
	}
	if ((sf & STRFMT_T_FP_F) && !(sf & STRFMT_F_ALT)) {
	  /* %g (and not %#g) - strip trailing zeroes. */
	  p += (int32_t)prec & ((int32_t)prec >> 31);
	  while (p[-1] == '0') p--;
	  if (p[-1] == '.') p--;
	} else {
	  /* %e (or %#g) - emit trailing zeroes. */
	  while ((int32_t)prec > 0) { *p++ = '0'; prec--; }
	  p += (int32_t)prec;
	}
      } else {
	p++;
      }
      *p++ = (sf & STRFMT_F_UPPER) ? 'E' : 'e';
      *p++ = eprefix; /* + or - */
      if (nde < 10) *p++ = '0'; /* Always at least two digits of exponent. */
      p = lj_strfmt_wint(p, nde);
    } else {
      /* %f (or, shortly, %g in %f style) */
      if (prec < (MSize)(0x3f & -(int32_t)ndlo) * 9) {
	/* Precision is sufficiently low as to maybe require rounding. */
	ndhi = nd_add_m10e(nd, ndhi, 5, 0 - prec - 1);
      }
      g_format_like_f:
      if ((sf & STRFMT_T_FP_E) && !(sf & STRFMT_F_ALT) && prec && width) {
	/* Decrease precision in order to strip trailing zeroes. */
	if (ndlo) {
	  /* nd has a fractional part; we need to look at its digits. */
	  char tail[9];
	  uint32_t maxprec = (64 - ndlo) * 9;
	  if (prec >= maxprec) prec = maxprec;
	  else ndlo = 64 - (prec + 8) / 9;
	  i = prec - ((63 - ndlo) * 9);
	  lj_strfmt_wuint9(tail, nd[ndlo]);
	  while (prec && tail[--i] == '0') {
	    prec--;
	    if (!i) {
	      if (ndlo == 63) { prec = 0; break; }
	      lj_strfmt_wuint9(tail, nd[++ndlo]);
	      i = 9;
	    }
	  }
	} else {
	  /* nd has no fractional part, so precision goes straight to zero. */
	  prec = 0;
	}
      }
      len = ndhi * 9 + ndigits_dec(nd[ndhi]) + prec + (prefix != 0)
		     + ((prec | (sf & STRFMT_F_ALT)) != 0);
      if (!p) p = lj_buf_more(sb, (width > len ? width : len) + 8);
      if (!(sf & (STRFMT_F_LEFT | STRFMT_F_ZERO))) {
	while (width-- > len) *p++ = ' ';
      }
      if (prefix) *p++ = prefix;
      if ((sf & (STRFMT_F_LEFT | STRFMT_F_ZERO)) == STRFMT_F_ZERO) {
	while (width-- > len) *p++ = '0';
      }
      /* Emit integer part. */
      p = lj_strfmt_wint(p, nd[ndhi]);
      i = ndhi;
      while (i) p = lj_strfmt_wuint9(p, nd[--i]);
      if ((prec | (sf & STRFMT_F_ALT))) {
	/* Emit fractional part. */
	*p++ = '.';
	/* Emit chunks of 9 digits (this may emit 8 digits too many). */
	while ((int32_t)prec > 0 && i != ndlo) {
	  i = (i - 1) & 0x3f;
	  p = lj_strfmt_wuint9(p, nd[i]);
	  prec -= 9;
	}
	if ((sf & STRFMT_T_FP_E) && !(sf & STRFMT_F_ALT)) {
	  /* %g (and not %#g) - strip trailing zeroes. */
	  p += (int32_t)prec & ((int32_t)prec >> 31);
	  while (p[-1] == '0') p--;
	  if (p[-1] == '.') p--;
	} else {
	  /* %f (or %#g) - emit trailing zeroes. */
	  while ((int32_t)prec > 0) { *p++ = '0'; prec--; }
	  p += (int32_t)prec;
	}
      }
    }
  }
  if ((sf & STRFMT_F_LEFT)) while (width-- > len) *p++ = ' ';
  return p;
}